

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_function_pool.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  pointer pIVar3;
  ostream *poVar4;
  double dVar5;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  exception *ex;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  startTime;
  uint32_t height;
  uint32_t width;
  uint32_t y;
  uint32_t x;
  iterator image;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  frame;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffe58;
  __normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
  *in_stack_fffffffffffffe60;
  allocator_type *in_stack_fffffffffffffe68;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffe70;
  size_type in_stack_fffffffffffffe78;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffe80;
  uint in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  __normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
  local_60 [11];
  undefined4 local_4;
  
  local_4 = 0;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)in_stack_fffffffffffffe70.__d.__r,
             (uint32_t)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             (uint32_t)in_stack_fffffffffffffe68,(uint8_t)((ulong)in_stack_fffffffffffffe60 >> 0x38)
             ,(uint8_t)((ulong)in_stack_fffffffffffffe60 >> 0x30));
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x103649);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
           (value_type *)in_stack_fffffffffffffe70.__d.__r,in_stack_fffffffffffffe68);
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::~allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x10367a);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x103687);
  local_60[0]._M_current =
       (ImageTemplate<unsigned_char> *)
       std::
       vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
       ::begin(in_stack_fffffffffffffe58);
  while( true ) {
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::end(in_stack_fffffffffffffe58);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffe60,
                       (__normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
    ::operator->(local_60);
    randomValue<unsigned_char>('\0');
    PenguinV_Image::ImageTemplate<unsigned_char>::fill
              (in_stack_fffffffffffffe80,(uchar)(in_stack_fffffffffffffe78 >> 0x38));
    iVar2 = randomValue<int>(0);
    if (iVar2 == 0) {
      pIVar3 = __gnu_cxx::
               __normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
               ::operator->(local_60);
      PenguinV_Image::ImageTemplate<unsigned_char>::width(pIVar3);
      in_stack_ffffffffffffff10 = randomValue<unsigned_int>(0);
      pIVar3 = __gnu_cxx::
               __normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
               ::operator->(local_60);
      PenguinV_Image::ImageTemplate<unsigned_char>::height(pIVar3);
      in_stack_ffffffffffffff14 = randomValue<unsigned_int>(0);
      pIVar3 = __gnu_cxx::
               __normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
               ::operator->(local_60);
      PenguinV_Image::ImageTemplate<unsigned_char>::width(pIVar3);
      randomValue<unsigned_int>(0);
      pIVar3 = __gnu_cxx::
               __normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
               ::operator->(local_60);
      PenguinV_Image::ImageTemplate<unsigned_char>::height(pIVar3);
      randomValue<unsigned_int>(0);
      __gnu_cxx::
      __normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
      ::operator*(local_60);
      randomValue<unsigned_char>('\0');
      Image_Function::Fill
                (in_stack_fffffffffffffe80,(uint32_t)(in_stack_fffffffffffffe78 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffe78,
                 (uint32_t)((ulong)in_stack_fffffffffffffe70.__d.__r >> 0x20),
                 SUB84(in_stack_fffffffffffffe70.__d.__r,0),
                 (uint8_t)((ulong)in_stack_fffffffffffffe68 >> 0x38));
    }
    __gnu_cxx::
    __normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
    ::operator++(local_60);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"----------");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"Basic functions. Evaluating time...");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"----------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::chrono::_V2::system_clock::now();
  basic((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
         *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  poVar4 = std::operator<<((ostream *)&std::cout,"Total time is ");
  dVar5 = getElapsedTime(in_stack_fffffffffffffe70);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5);
  poVar4 = std::operator<<(poVar4," seconds");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"----------");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"Functions with thread pool support. Evaluating time...");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"----------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::chrono::_V2::system_clock::now();
  multithreaded((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  poVar4 = std::operator<<((ostream *)&std::cout,"Total time is ");
  this = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
          *)getElapsedTime(in_stack_fffffffffffffe70);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(double)this);
  poVar4 = std::operator<<(poVar4," seconds");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(this);
  poVar4 = std::operator<<((ostream *)&std::cout,"Application ended correctly.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
    try // <---- do not forget to put your code into try.. catch block!
    {
        // This example is more technical and it shows the difference in software development using
        // basic functions and using functions with thread pool support.
        // Plus it evaluates the speed of calculations between two examples.
        // Please take a note that speed as well as thread count depends on your CPU and
        // overall system so do not think that this comparison is fully accurate

        // Conditions:
        // We have 60 big images (frames) with 1920 x 1080 pixels (60 fps fullHD :) )
        // Our aim is pretty simple: we have to find some suspicious objects on frames and highlight them
        // What we need to do is:
        // 1. get a difference between two neighbour frames
        // 2. Find optimum threshold value
        // 3. Compare threshold value with known value of background
        // 4. threshold image with threshold
        // 5. put result on the map

        // Create a set of 60 frames
        std::vector < PenguinV_Image::Image > frame( 60, PenguinV_Image::Image( 1920, 1080 ) );

        for( std::vector < PenguinV_Image::Image >::iterator image = frame.begin(); image != frame.end(); ++image ) {
            // Fill background. Let's assume that background varies from 0 to 15 gray scale values
            image->fill( randomValue<uint8_t>(16u) );

            // Then add some 'suspicious' objects on some random images
            if( randomValue<int>(10) == 0 ) { // at least ~6 of 60 images would have objects
                // generate random place of object, in our case is rectangle
                const uint32_t x      = randomValue<uint32_t>(image->width()  * 2 / 3);
                const uint32_t y      = randomValue<uint32_t>(image->height() * 2 / 3);
                const uint32_t width  = randomValue<uint32_t>(image->width()  - x);
                const uint32_t height = randomValue<uint32_t>(image->height() - y);

                // fill an area with some random value what is bigger than background value
                Image_Function::Fill( *image, x, y, width, height, static_cast<uint8_t>( randomValue<uint8_t>(128u) + 64u ) );
            }
        }

        std::cout << "----------" << std::endl
            << "Basic functions. Evaluating time..." << std::endl << "----------" << std::endl;
        std::chrono::time_point < std::chrono::system_clock > startTime = std::chrono::system_clock::now();

        basic( frame );

        std::cout << "Total time is " << getElapsedTime( startTime ) << " seconds" << std::endl;

        std::cout << "----------" << std::endl
            << "Functions with thread pool support. Evaluating time..." << std::endl << "----------" << std::endl;
        startTime = std::chrono::system_clock::now();

        multithreaded( frame );

        std::cout << "Total time is " << getElapsedTime( startTime ) << " seconds" << std::endl;
    }
    catch( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    std::cout << "Application ended correctly." << std::endl;
    return 0;
}